

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadXYZnodeXYZnode::ComputeQ
          (ChLoadXYZnodeXYZnode *this,ChState *state_x,ChStateDelta *state_w)

{
  ChVector<double> *pCVar1;
  double dVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar9;
  double *pdVar10;
  Index index_1;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  pointer psVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChVector<double> v;
  ChVector<double> v_1;
  undefined1 local_108 [16];
  double local_f8;
  ChState *local_f0;
  undefined8 local_e8;
  long local_d8;
  ChVector<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  ChVector<double> local_68;
  undefined1 local_48 [16];
  double local_38;
  
  psVar14 = (this->super_ChLoadCustomMultiple).loadables.
            super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar14->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar3 == (element_type *)0x0) ||
     (lVar8 = __dynamic_cast(peVar3,&ChLoadable::typeinfo,&ChNodeXYZ::typeinfo,0xffffffffffffffff),
     lVar8 == 0)) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar8 = 0;
  }
  else {
    this_00 = (psVar14->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      psVar14 = (this->super_ChLoadCustomMultiple).loadables.
                super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  peVar3 = psVar14[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar3 == (element_type *)0x0) ||
     (lVar9 = __dynamic_cast(peVar3,&ChLoadable::typeinfo,&ChNodeXYZ::typeinfo,0xffffffffffffffff),
     lVar9 == 0)) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = 0;
  }
  else {
    this_01 = psVar14[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_68.m_data[2] = 0.0;
  local_88.m_data[2] = 0.0;
  local_a8.m_data[2] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = 0.0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  if (state_x == (ChState *)0x0) {
    if ((ChVector<double> *)(lVar8 + 8) != &local_68) {
      local_68.m_data[0] = *(double *)(lVar8 + 8);
      local_68.m_data[1] = *(double *)(lVar8 + 0x10);
      local_68.m_data[2] = *(double *)(lVar8 + 0x18);
    }
    if ((ChVector<double> *)(lVar9 + 8) != &local_a8) {
      local_a8.m_data[0] = *(double *)(lVar9 + 8);
      local_a8.m_data[1] = *(double *)(lVar9 + 0x10);
      local_a8.m_data[2] = *(double *)(lVar9 + 0x18);
    }
  }
  else {
    local_d8 = (state_x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_108._8_8_ = 3;
    local_108._0_8_ =
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_e8 = 0;
    local_f0 = state_x;
    if (local_d8 < 3) goto LAB_005ce6be;
    ChVector<double>::operator=
              (&local_68,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_108);
    local_d8 = (state_x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_108._8_8_ = 3;
    local_108._0_8_ =
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
    local_e8 = 3;
    local_f0 = state_x;
    if (local_d8 < 6) goto LAB_005ce6be;
    ChVector<double>::operator=
              (&local_a8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_108);
  }
  if (state_w == (ChStateDelta *)0x0) {
    if ((ChVector<double> *)(lVar8 + 0x20) != &local_88) {
      local_88.m_data[0] = *(double *)(lVar8 + 0x20);
      local_88.m_data[1] = *(double *)(lVar8 + 0x28);
      local_88.m_data[2] = *(double *)(lVar8 + 0x30);
    }
    if ((ChVector<double> *)(lVar9 + 0x20) != &local_c8) {
      local_c8.m_data[0] = *(double *)(lVar9 + 0x20);
      local_c8.m_data[1] = *(double *)(lVar9 + 0x28);
      local_c8.m_data[2] = *(double *)(lVar9 + 0x30);
    }
  }
  else {
    local_d8 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_108._8_8_ = 3;
    local_108._0_8_ =
         (state_w->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_e8 = 0;
    local_f0 = (ChState *)state_w;
    if (local_d8 < 3) goto LAB_005ce6be;
    ChVector<double>::operator=
              (&local_88,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_108);
    local_d8 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_108._8_8_ = 3;
    local_108._0_8_ =
         (state_w->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
    local_e8 = 3;
    local_f0 = (ChState *)state_w;
    if (local_d8 < 6) goto LAB_005ce6be;
    ChVector<double>::operator=
              (&local_c8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_108);
  }
  auVar7._8_8_ = local_68.m_data[1];
  auVar7._0_8_ = local_68.m_data[0];
  pCVar1 = &this->computed_abs_force;
  auVar5._8_8_ = local_a8.m_data[1];
  auVar5._0_8_ = local_a8.m_data[0];
  local_108 = vsubpd_avx(auVar7,auVar5);
  local_f8 = local_68.m_data[2] - local_a8.m_data[2];
  auVar6._8_8_ = local_88.m_data[1];
  auVar6._0_8_ = local_88.m_data[0];
  auVar4._8_8_ = local_c8.m_data[1];
  auVar4._0_8_ = local_c8.m_data[0];
  local_48 = vsubpd_avx(auVar6,auVar4);
  local_38 = local_88.m_data[2] - local_c8.m_data[2];
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,local_108,local_48,pCVar1);
  lVar8 = (this->super_ChLoadCustomMultiple).load_Q.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (lVar8 < 3) goto LAB_005ce6be;
  pdVar10 = (this->super_ChLoadCustomMultiple).load_Q.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar11 = 3;
  if (((ulong)pdVar10 & 7) == 0) {
    uVar12 = -((uint)((ulong)pdVar10 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar12 < 3) {
      uVar11 = (ulong)uVar12;
    }
    if (uVar12 != 0) goto LAB_005ce5c4;
  }
  else {
LAB_005ce5c4:
    uVar13 = 0;
    do {
      pdVar10[uVar13] = pCVar1->m_data[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  if (uVar11 < 3) {
    do {
      pdVar10[uVar11] = pCVar1->m_data[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
  }
  if (lVar8 < 6) {
LAB_005ce6be:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar10 = pdVar10 + 3;
  uVar11 = 3;
  if (((ulong)pdVar10 & 7) == 0) {
    uVar12 = -((uint)((ulong)pdVar10 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar12 < 3) {
      uVar11 = (ulong)uVar12;
    }
    if (uVar12 == 0) goto LAB_005ce641;
  }
  uVar13 = 0;
  do {
    auVar15._0_8_ = -pCVar1->m_data[uVar13];
    auVar15._8_8_ = 0x8000000000000000;
    dVar2 = (double)vmovlpd_avx(auVar15);
    pdVar10[uVar13] = dVar2;
    uVar13 = uVar13 + 1;
  } while (uVar11 != uVar13);
LAB_005ce641:
  if (uVar11 < 3) {
    do {
      auVar16._0_8_ = -pCVar1->m_data[uVar11];
      auVar16._8_8_ = 0x8000000000000000;
      dVar2 = (double)vmovlpd_avx(auVar16);
      pdVar10[uVar11] = dVar2;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void ChLoadXYZnodeXYZnode::ComputeQ(ChState* state_x, ChStateDelta* state_w) {

	auto mnodeA = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[0]);
	auto mnodeB = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[1]);

	ChVector<> nodeApos;
	ChVector<> nodeApos_dt;
	ChVector<> nodeBpos;
	ChVector<> nodeBpos_dt;

	if (state_x) {
        // the numerical jacobian algo might change state_x
        nodeApos = state_x->segment(0, 3);
		nodeBpos = state_x->segment(3, 3);
    } else {
		nodeApos = mnodeA->GetPos();
		nodeBpos = mnodeB->GetPos();
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
		nodeApos_dt = state_w->segment(0, 3);
		nodeBpos_dt = state_w->segment(3, 3);
    } else {
        nodeApos_dt = mnodeA->GetPos_dt();
		nodeBpos_dt = mnodeB->GetPos_dt();
    }

	ComputeForce((nodeApos-nodeBpos), (nodeApos_dt-nodeBpos_dt), computed_abs_force);

    // Compute Q 
    load_Q.segment(0, 3) = computed_abs_force.eigen();
    load_Q.segment(3, 3) = -computed_abs_force.eigen();
}